

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O3

void __thiscall deci::dictionary_t::dictionary_t(dictionary_t *this)

{
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_00107d60;
  *(undefined8 *)&(this->storage)._M_h._M_rehash_policy = 0;
  (this->storage)._M_h._M_buckets = &(this->storage)._M_h._M_single_bucket;
  (this->storage)._M_h._M_bucket_count = 1;
  (this->storage)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->storage)._M_h._M_element_count = 0;
  (this->storage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->storage)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->storage)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

dictionary_t::dictionary_t():value_t(), storage() {
    ;
  }